

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::GetNavTweakPressedAmount(ImGuiAxis axis)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  float amount;
  ImGuiKey key_more;
  ImGuiKey key_less;
  float repeat_rate;
  float repeat_delay;
  ImGuiContext *g;
  float local_24;
  float in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  ImGuiKey key;
  ImGuiContext *pIVar4;
  
  pIVar4 = GImGui;
  GetTypematicRepeatRate(8,(float *)&stack0xffffffffffffffec,(float *)&stack0xffffffffffffffe8);
  key = (ImGuiKey)pIVar4;
  iVar2 = GetKeyPressedAmount(key,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  iVar3 = GetKeyPressedAmount(key,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  local_24 = (float)iVar2 - (float)iVar3;
  if ((((local_24 != 0.0) || (NAN(local_24))) &&
      (bVar1 = IsKeyDown(ImGuiKey_KeysData_OFFSET), bVar1)) &&
     (bVar1 = IsKeyDown(ImGuiKey_KeysData_OFFSET), bVar1)) {
    local_24 = 0.0;
  }
  return local_24;
}

Assistant:

float ImGui::GetNavTweakPressedAmount(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    float repeat_delay, repeat_rate;
    GetTypematicRepeatRate(ImGuiInputFlags_RepeatRateNavTweak, &repeat_delay, &repeat_rate);

    ImGuiKey key_less, key_more;
    if (g.NavInputSource == ImGuiInputSource_Gamepad)
    {
        key_less = (axis == ImGuiAxis_X) ? ImGuiKey_GamepadDpadLeft : ImGuiKey_GamepadDpadUp;
        key_more = (axis == ImGuiAxis_X) ? ImGuiKey_GamepadDpadRight : ImGuiKey_GamepadDpadDown;
    }
    else
    {
        key_less = (axis == ImGuiAxis_X) ? ImGuiKey_LeftArrow : ImGuiKey_UpArrow;
        key_more = (axis == ImGuiAxis_X) ? ImGuiKey_RightArrow : ImGuiKey_DownArrow;
    }
    float amount = (float)GetKeyPressedAmount(key_more, repeat_delay, repeat_rate) - (float)GetKeyPressedAmount(key_less, repeat_delay, repeat_rate);
    if (amount != 0.0f && IsKeyDown(key_less) && IsKeyDown(key_more)) // Cancel when opposite directions are held, regardless of repeat phase
        amount = 0.0f;
    return amount;
}